

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QTextLayout::FormatRange>::moveAppend
          (QGenericArrayOps<QTextLayout::FormatRange> *this,FormatRange *b,FormatRange *e)

{
  FormatRange *this_00;
  ulong in_RDX;
  ulong in_RSI;
  FormatRange *in_RDI;
  FormatRange *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QTextLayout::FormatRange>::begin
                        ((QArrayDataPointer<QTextLayout::FormatRange> *)0x5b3307);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QTextLayout::FormatRange::FormatRange(this_00,in_RDI);
      local_10 = local_10 + 0x18;
      *(long *)&(in_RDI->format).super_QTextFormat.format_type =
           *(long *)&(in_RDI->format).super_QTextFormat.format_type + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }